

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.hh
# Opt level: O0

uint32_t phosg::bswap32(uint32_t a)

{
  uint32_t a_local;
  
  return a >> 0x18 | a >> 8 & 0xff00 | (a & 0xff00) << 8 | a << 0x18;
}

Assistant:

static inline uint32_t bswap32(uint32_t a) {
  return ((a >> 24) & 0x000000FF) |
      ((a >> 8) & 0x0000FF00) |
      ((a << 8) & 0x00FF0000) |
      ((a << 24) & 0xFF000000);
}